

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

void __thiscall mjs::global_object_impl::fixup(global_object_impl *this)

{
  gc_heap *h_00;
  gc_heap_ptr_untracked<mjs::object,_true> *e;
  gc_heap_ptr_untracked<mjs::object,_true> *__end2;
  gc_heap_ptr_untracked<mjs::object,_true> *__begin2;
  gc_heap_ptr_untracked<mjs::object,_true> (*__range2) [8];
  gc_heap *h;
  global_object_impl *this_local;
  
  h_00 = object::heap((object *)this);
  anon_unknown_35::string_cache::fixup(&this->string_cache_,h_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->object_prototype_,h_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->function_prototype_,h_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->array_prototype_,h_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->string_prototype_,h_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->boolean_prototype_,h_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->number_prototype_,h_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->regexp_prototype_,h_00);
  for (__end2 = this->error_prototype_; __end2 != &this->thrower_; __end2 = __end2 + 1) {
    gc_heap_ptr_untracked<mjs::object,_true>::fixup(__end2,h_00);
  }
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->thrower_,h_00);
  object::fixup((object *)this);
  return;
}

Assistant:

void fixup() {
        auto& h = heap();
        string_cache_.fixup(h);
        object_prototype_.fixup(h);
        function_prototype_.fixup(h);
        array_prototype_.fixup(h);
        string_prototype_.fixup(h);
        boolean_prototype_.fixup(h);
        number_prototype_.fixup(h);
        regexp_prototype_.fixup(h);
        for (auto& e: error_prototype_) {
            e.fixup(h);
        }
        thrower_.fixup(h);
        global_object::fixup();
    }